

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

idx_t __thiscall
duckdb::IEJoinLocalSourceState::SelectOuterRows(IEJoinLocalSourceState *this,bool *matches)

{
  ulong uVar1;
  sel_t *psVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->outer_count;
  psVar2 = (this->true_sel).sel_vector;
  uVar4 = this->outer_idx;
  uVar3 = 0;
  do {
    if (uVar1 <= uVar4) {
      return uVar3;
    }
    if (matches[uVar4] == false) {
      psVar2[uVar3] = (sel_t)uVar4;
      uVar3 = uVar3 + 1;
      if (0x7ff < uVar3) {
        this->outer_idx = uVar4 + 1;
        return uVar3;
      }
    }
    uVar4 = uVar4 + 1;
    this->outer_idx = uVar4;
  } while( true );
}

Assistant:

idx_t SelectOuterRows(bool *matches) {
		idx_t count = 0;
		for (; outer_idx < outer_count; ++outer_idx) {
			if (!matches[outer_idx]) {
				true_sel.set_index(count++, outer_idx);
				if (count >= STANDARD_VECTOR_SIZE) {
					outer_idx++;
					break;
				}
			}
		}

		return count;
	}